

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O1

tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
anon_unknown.dwarf_8757c::substituteEnvironmentVariable
          (tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  ulong uVar5;
  char *__s;
  size_t sVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  _Alloc_hider _Var10;
  string temp;
  string envVariableName;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  _Alloc_hider local_b0;
  long local_a8;
  ulong local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  ulong *local_50 [2];
  ulong local_40 [2];
  
  lVar4 = std::__cxx11::string::find((char *)value,0x1bfbb0,0);
  if (lVar4 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_70);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Head_base<0UL,_bool,_false>._M_head_impl = true;
    return __return_storage_ptr__;
  }
  uVar5 = std::__cxx11::string::find((char *)value,0x1bfb92,lVar4 + 2U);
  if (lVar4 + 2U == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"failed to find } to go with ${",
               (allocator<char> *)local_70);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Head_base<0UL,_bool,_false>._M_head_impl = false;
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)local_70,(ulong)value);
  __s = getenv((char *)local_70[0]);
  if (__s == (char *)0x0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Unable to find environment variable \'","");
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70[0]);
    puVar9 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar9) {
      local_c0 = *puVar9;
      uStack_b8 = (undefined4)plVar7[3];
      uStack_b4 = *(undefined4 *)((long)plVar7 + 0x1c);
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar9;
      local_d0 = (ulong *)*plVar7;
    }
    local_c8 = plVar7[1];
    *plVar7 = (long)puVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\'","");
    uVar5 = 0xf;
    if (local_d0 != &local_c0) {
      uVar5 = local_c0;
    }
    if (uVar5 < (ulong)(local_88 + local_c8)) {
      uVar5 = 0xf;
      if (local_90 != local_80) {
        uVar5 = local_80[0];
      }
      if (uVar5 < (ulong)(local_88 + local_c8)) goto LAB_001643d3;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_001643d3:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
    }
    local_b0._M_p = (pointer)&local_a0;
    puVar9 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar9) {
      local_a0 = *puVar9;
      uStack_98 = puVar8[3];
    }
    else {
      local_a0 = *puVar9;
      local_b0._M_p = (pointer)*puVar8;
    }
    sVar3 = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)puVar9 = 0;
    paVar1 = &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)paVar1;
    if ((ulong *)local_b0._M_p == &local_a0) {
      paVar1->_M_allocated_capacity = local_a0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2 + 8) = uStack_98;
    }
    else {
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = local_b0._M_p;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl.field_2._M_allocated_capacity = local_a0;
    }
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = sVar3;
    local_a8 = 0;
    local_a0 = local_a0 & 0xffffffffffffff00;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Head_base<0UL,_bool,_false>._M_head_impl = false;
    local_b0._M_p = (pointer)&local_a0;
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    _Var10._M_p = (pointer)local_50[0];
    if (local_50[0] == local_40) goto LAB_001644cd;
  }
  else {
    local_b0._M_p = (pointer)&local_a0;
    pcVar2 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + value->_M_string_length);
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_b0);
    std::__cxx11::string::operator=((string *)value,(string *)&local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    local_d0 = &local_c0;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,__s,__s + sVar6);
    std::__cxx11::string::_M_append((char *)value,(ulong)local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (uVar5 < local_a8 - 1U) {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_b0);
      std::__cxx11::string::_M_append((char *)value,(ulong)local_d0);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
    }
    substituteEnvironmentVariable(__return_storage_ptr__,value);
    local_40[0] = local_a0;
    _Var10._M_p = local_b0._M_p;
    if ((ulong *)local_b0._M_p == &local_a0) goto LAB_001644cd;
  }
  operator_delete(_Var10._M_p,local_40[0] + 1);
LAB_001644cd:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, std::string> substituteEnvironmentVariable(std::string& value)
{
    auto index = value.find("${");
    if (index == std::string::npos)
        return std::make_tuple(true, "");
    index += 2; // advance past the "${".
    auto endIndex = value.find("}", index);
    if (index == std::string::npos)
        return std::make_tuple(false, "failed to find } to go with ${");
    std::string envVariableName = value.substr(index, endIndex - index);
    const char* envVariableValue = getenv(envVariableName.c_str());
    if (envVariableValue == nullptr)
        return std::make_tuple(false, std::string("Unable to find environment variable '") + envVariableName + std::string("'"));

    std::string temp(value);
    value = temp.substr(0, index - 2); // up until the starting ${
    value += std::string(envVariableValue);
    if (endIndex < (temp.length()-1))
        value += temp.substr(endIndex + 1, temp.length() - endIndex - 1);
    return substituteEnvironmentVariable(value);
}